

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ConsumerEndpointImpl
          (ConsumerEndpointImpl *this,TracingServiceImpl *service,TaskRunner *task_runner,
          Consumer *consumer,uid_t uid)

{
  uid_t uid_local;
  Consumer *consumer_local;
  TaskRunner *task_runner_local;
  TracingServiceImpl *service_local;
  ConsumerEndpointImpl *this_local;
  
  ConsumerEndpoint::ConsumerEndpoint(&this->super_ConsumerEndpoint);
  (this->super_ConsumerEndpoint)._vptr_ConsumerEndpoint =
       (_func_int **)&PTR__ConsumerEndpointImpl_009c2940;
  this->task_runner_ = task_runner;
  this->service_ = service;
  this->consumer_ = consumer;
  this->uid_ = uid;
  this->tracing_session_id_ = 0;
  this->observable_events_mask_ = 0;
  ::std::
  unique_ptr<perfetto::protos::gen::ObservableEvents,std::default_delete<perfetto::protos::gen::ObservableEvents>>
  ::unique_ptr<std::default_delete<perfetto::protos::gen::ObservableEvents>,void>
            ((unique_ptr<perfetto::protos::gen::ObservableEvents,std::default_delete<perfetto::protos::gen::ObservableEvents>>
              *)&this->observable_events_);
  perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtrFactory
            (&this->weak_ptr_factory_,this);
  return;
}

Assistant:

TracingServiceImpl::ConsumerEndpointImpl::ConsumerEndpointImpl(
    TracingServiceImpl* service,
    base::TaskRunner* task_runner,
    Consumer* consumer,
    uid_t uid)
    : task_runner_(task_runner),
      service_(service),
      consumer_(consumer),
      uid_(uid),
      weak_ptr_factory_(this) {}